

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_reader<wchar_t,_jsoncons::stream_source<wchar_t>,_std::allocator<char>_>::
check_done(basic_json_reader<wchar_t,_jsoncons::stream_source<wchar_t>,_std::allocator<char>_> *this
          )

{
  ser_error *this_00;
  undefined8 extraout_RAX;
  error_code ec_00;
  error_code ec;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  check_done(this,&local_20);
  if (local_20._M_value == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_20._M_value;
  ec_00._M_cat = local_20._M_cat;
  ser_error::ser_error
            (this_00,ec_00,(this->parser_).line_,
             ((this->parser_).position_ - (this->parser_).mark_position_) + 1);
  basic_json_reader<wchar_t,jsoncons::stream_source<wchar_t>,std::allocator<char>>::check_done
            ((basic_json_reader<wchar_t,jsoncons::stream_source<wchar_t>,std::allocator<char>> *)
             this_00);
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void check_done()
        {
            std::error_code ec;
            check_done(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
            }
        }